

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

AsmJsVarType Wasm::WasmToAsmJs::GetAsmJsVarType(WasmType wasmType)

{
  WasmCompilationException *this;
  Which w;
  AsmJsVarType local_1a;
  AsmJsVarType local_19 [8];
  AsmJsVarType asmType;
  
  w = Int;
  Js::AsmJsVarType::AsmJsVarType(local_19,Int);
  switch(wasmType) {
  case FirstLocalType:
    break;
  case I64:
    w = Int64;
    break;
  case F32:
    w = Float;
    break;
  case F64:
    w = Double;
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    w = Float32x4;
    break;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this,L"Unknown var type %u",wasmType);
    __cxa_throw(this,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  Js::AsmJsVarType::AsmJsVarType(&local_1a,w);
  return (AsmJsVarType)local_1a.which_;
}

Assistant:

Js::AsmJsVarType WasmToAsmJs::GetAsmJsVarType(WasmTypes::WasmType wasmType)
{
    Js::AsmJsVarType asmType = Js::AsmJsVarType::Int;
    switch (wasmType)
    {
    case WasmTypes::I32: return Js::AsmJsVarType::Int;
    case WasmTypes::I64: return Js::AsmJsVarType::Int64;
    case WasmTypes::F32: return Js::AsmJsVarType::Float;
    case WasmTypes::F64: return Js::AsmJsVarType::Double;
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::V128:
        Simd::EnsureSimdIsEnabled();
        return Js::AsmJsVarType::Float32x4;
#endif
    default:
        WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        throw WasmCompilationException(_u("Unknown var type %u"), wasmType);
    }
}